

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

double __thiscall CEPlanet::EarthDist_AU(CEPlanet *this,CEDate *date)

{
  double dVar1;
  double dVar2;
  CEPlanetAlgo CVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> pos;
  CEPlanet earth;
  vector<double,_std::allocator<double>_> local_170;
  CEPlanet local_158;
  
  Earth();
  CVar3 = Algorithm(this);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,CVar3);
  SetAlgorithm(&local_158,(CEPlanetAlgo *)&local_170);
  (*date->_vptr_CEDate[4])(date);
  UpdatePosition(&local_158,(double *)&local_170);
  std::vector<double,_std::allocator<double>_>::vector(&local_170,&this->pos_icrs_);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,0);
  dVar8 = *pvVar4;
  dVar5 = GetXICRS(&local_158);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,1);
  dVar1 = *pvVar4;
  dVar6 = GetYICRS(&local_158);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,2);
  dVar2 = *pvVar4;
  dVar7 = GetZICRS(&local_158);
  dVar8 = (dVar2 - dVar7) * (dVar2 - dVar7) +
          (dVar8 - dVar5) * (dVar8 - dVar5) + (dVar1 - dVar6) * (dVar1 - dVar6);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  std::vector<double,_std::allocator<double>_>::~vector(&local_170);
  ~CEPlanet(&local_158);
  return dVar8;
}

Assistant:

double CEPlanet::EarthDist_AU(const CEDate& date)
{
    // Compute the position of the earth relative to the planet to account
    // for the time delay of the planet
    CEPlanet earth = CEPlanet::Earth();
    earth.SetAlgorithm(Algorithm());
    earth.UpdatePosition(date.JD());

    std::vector<double> pos = pos_icrs_;
    double x = pos[0] - earth.GetXICRS();
    double y = pos[1] - earth.GetYICRS();
    double z = pos[2] - earth.GetZICRS();

    // Compute the light travel time from the planet to Earth in days
    return std::sqrt(x*x + y*y + z*z);
}